

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_nim_is_valid(nifti_image *nim,int complain)

{
  int iVar1;
  
  if (nim != (nifti_image *)0x0) {
    if (2 < g_opts_0) {
      nifti_nim_is_valid_cold_1();
    }
    iVar1 = nifti_nim_has_valid_dims(nim,complain);
    return iVar1;
  }
  nifti_nim_is_valid_cold_2();
  return 0;
}

Assistant:

int nifti_nim_is_valid(nifti_image * nim, int complain)
{
   int errs = 0;

   if( !nim ){
      fprintf(stderr,"** is_valid_nim: nim is NULL\n");
      return 0;
   }

   if( g_opts.debug > 2 ) fprintf(stderr,"-d nim_is_valid check...\n");

   /**- check that dim[] matches the individual values ndim, nx, ny, ... */
   if( ! nifti_nim_has_valid_dims(nim,complain) ){
      if( !complain ) return 0;
      errs++;
   }

   /* might check nbyper, pixdim, q/sforms, swapsize, nifti_type, ... */

   /**- be explicit in return of 0 or 1 */
   if( errs > 0 ) return 0;
   else           return 1;
}